

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  size_t *psVar1;
  timediff_t *ptVar2;
  connectdata *pcVar3;
  connectdata *pcVar4;
  size_t sVar5;
  unsigned_short uVar6;
  CURLcode CVar7;
  char *in_RAX;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  size_t nread;
  char *local_38;
  
  pcVar3 = data->conn;
  *msg = (void *)0x0;
  local_38 = in_RAX;
  if ((pcVar3->proto).ftpc.pp.sendbuf.bufr == (char *)0x0) {
    pcVar10 = (char *)(pcVar3->proto).ftpc.pp.response_time;
    if (pcVar10 == (char *)0x0) goto LAB_001463c4;
    local_38 = (char *)(ulong)(data->set).upload_buffer_size;
    if (pcVar10 < local_38) {
      local_38 = pcVar10;
    }
    (data->req).upload_fromhere = (data->state).ulbuf;
    CVar7 = Curl_fillreadbuffer(data,(size_t)local_38,(size_t *)&local_38);
    if ((CVar7 != CURLE_AGAIN) && (CVar7 != CURLE_OK)) {
      return CVar7;
    }
    if (local_38 == (char *)0x0) {
      return CURLE_OK;
    }
    ptVar2 = &(pcVar3->proto).ftpc.pp.response_time;
    *ptVar2 = *ptVar2 - (long)local_38;
    (pcVar3->proto).ftpc.pp.sendbuf.bufr = local_38;
    (pcVar3->proto).ftpc.pp.sendbuf.leng = 0;
  }
  pcVar4 = data->conn;
  pcVar10 = (pcVar4->proto).ftpc.pp.sendbuf.bufr;
  if (pcVar10 != (char *)0x0) {
    sVar5 = (pcVar4->proto).ftpc.pp.sendbuf.leng;
    pcVar10 = pcVar10 + -sVar5;
    CVar7 = Curl_nwrite(data,0,(data->state).ulbuf + sVar5,(size_t)pcVar10,(ssize_t *)&local_38);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    if (local_38 == pcVar10) {
      (pcVar4->proto).ftpc.pp.sendbuf.bufr = (char *)0x0;
    }
    else {
      psVar1 = &(pcVar4->proto).ftpc.pp.sendbuf.leng;
      *psVar1 = (size_t)(local_38 + *psVar1);
    }
  }
  if ((pcVar3->proto).ftpc.pp.sendbuf.bufr != (char *)0x0) {
    return CURLE_AGAIN;
  }
  if ((pcVar3->proto).ftpc.pp.response_time != 0) {
    return CURLE_AGAIN;
  }
LAB_001463c4:
  pcVar3 = data->conn;
  pcVar10 = (pcVar3->proto).smbc.recv_buf;
  sVar5 = (pcVar3->proto).ftpc.pp.sendbuf.allc;
  CVar7 = Curl_read(data,pcVar3->sock[0],pcVar10 + sVar5,0x9000 - sVar5,(ssize_t *)&local_38);
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  if (local_38 == (char *)0x0) {
    return CURLE_OK;
  }
  sVar5 = (pcVar3->proto).ftpc.pp.sendbuf.allc;
  (pcVar3->proto).ftpc.pp.sendbuf.allc = (size_t)(local_38 + sVar5);
  if (local_38 + sVar5 < (char *)0x4) {
    return CURLE_OK;
  }
  uVar6 = Curl_read16_be((uchar *)(pcVar10 + 2));
  if ((ulong)uVar6 + 4 <= (pcVar3->proto).ftpc.pp.sendbuf.allc) {
    if (0x20 < uVar6) {
      uVar8 = (uint)(byte)pcVar10[0x24] * 2 + 0x27;
      uVar9 = (uint)((ulong)uVar6 + 4);
      if ((uVar8 <= uVar9) &&
         (uVar6 = Curl_read16_le((uchar *)(pcVar10 + (ulong)((uint)(byte)pcVar10[0x24] * 2) + 0x25))
         , uVar9 < uVar8 + uVar6)) {
        return CURLE_READ_ERROR;
      }
    }
    *msg = pcVar10;
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)data->set.upload_buffer_size ?
      (size_t)data->set.upload_buffer_size : smbc->upload_size;
    data->req.upload_fromhere = data->state.ulbuf;
    result = Curl_fillreadbuffer(data, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}